

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_impl.hpp
# Opt level: O0

vertex_iterator __thiscall
xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::ObtainVertexFromVertexMap
          (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this,SquareCell state)

{
  SquareCell state_00;
  SquareCell s;
  bool bVar1;
  void *id;
  const_vertex_iterator cVar2;
  unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
  *this_00;
  long in_RDI;
  unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
  *in_stack_00000008;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  in_stack_00000010;
  int64_t in_stack_00000018;
  Vertex *new_vertex;
  iterator it;
  int64_t state_id;
  Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *this_01;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  s_00;
  pair<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>
  *__x;
  int64_t in_stack_ffffffffffffff30;
  Vertex *this_02;
  int64_t in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_38 [4];
  int64_t local_18;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
  local_8;
  
  this_02 = (Vertex *)&stack0x00000008;
  state_00.idx.y = in_stack_00000018;
  state_00.idx.x = (int64_t)in_stack_00000010._M_cur;
  state_00.id = in_stack_ffffffffffffff30;
  local_18 = DefaultIndexer<SquareCell>::operator()<SquareCell,_true>
                       ((DefaultIndexer<SquareCell> *)0x106a22,state_00);
  local_38[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
       ::find(in_stack_00000008,(key_type *)0x106a40);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
       ::end(in_stack_00000008);
  bVar1 = std::__detail::operator==(local_38,&local_40);
  if (bVar1) {
    id = operator_new(0x80);
    __x = (pair<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>
           *)(this_02->state).id;
    this_01 = (Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_> *)
              (this_02->state).idx.x;
    s_00._M_cur = (__node_type *)(this_02->state).idx.y;
    s.idx.y = in_stack_ffffffffffffff58;
    s.idx.x = in_stack_ffffffffffffff50;
    s.id = in_stack_ffffffffffffff60;
    Vertex::Vertex(this_02,s,(int64_t)id);
    cVar2.super_VertexMapTypeIterator.
    super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
    ._M_cur = (VertexMapTypeIterator)vertex_end(this_01);
    ((const_vertex_iterator *)((long)id + 0x78))->super_VertexMapTypeIterator =
         cVar2.super_VertexMapTypeIterator.
         super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
         ._M_cur;
    this_00 = (unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
               *)(in_RDI + 8);
    std::
    make_pair<long&,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*&>
              ((long *)s_00._M_cur,(Vertex **)this_01);
    std::
    unordered_map<long,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*,std::hash<long>,std::equal_to<long>,std::allocator<std::pair<long_const,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>>>
    ::
    insert<std::pair<long,xmotion::Graph<SquareCell,double,xmotion::DefaultIndexer<SquareCell>>::Vertex*>>
              (this_00,__x);
    std::
    unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
    ::find((unordered_map<long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>_>_>
            *)this_01,(key_type *)0x106b61);
    vertex_iterator::vertex_iterator((vertex_iterator *)this_01,(VertexMapTypeIterator)s_00._M_cur);
  }
  else {
    vertex_iterator::vertex_iterator
              ((vertex_iterator *)in_stack_00000008,(VertexMapTypeIterator)in_stack_00000010._M_cur)
    ;
  }
  return (vertex_iterator)
         (_Node_iterator_base<std::pair<const_long,_xmotion::Graph<SquareCell,_double,_xmotion::DefaultIndexer<SquareCell>_>::Vertex_*>,_false>
          )local_8._M_cur;
}

Assistant:

typename Graph<State, Transition, StateIndexer>::vertex_iterator
Graph<State, Transition, StateIndexer>::ObtainVertexFromVertexMap(State state) {
  int64_t state_id = GetStateIndex(state);
  auto it = vertex_map_.find(state_id);

  if (it == vertex_map_.end()) {
    auto new_vertex = new Vertex(state, state_id);
    new_vertex->search_parent = vertex_end();
    vertex_map_.insert(std::make_pair(state_id, new_vertex));
    return vertex_iterator(vertex_map_.find(state_id));
  }

  return vertex_iterator(it);
}